

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::addImageToImageAllFormatsDepthStencilTests(TestCaseGroup *group)

{
  undefined4 uVar1;
  bool bVar2;
  TextureFormat TVar3;
  long lVar4;
  VkFormat format;
  VkFormat format_00;
  VkFormat format_01;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 format_02;
  deInt32 i;
  uint uVar6;
  string description;
  string testName;
  TestParams params;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  TestParams local_80;
  
  for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
    params.regions.
    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    params.regions.
    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    params.regions.
    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    params.src.image.imageType = VK_IMAGE_TYPE_2D;
    uVar5 = 0x4000000040;
    params.src._8_8_ = 0x4000000040;
    params.dst._8_8_ = 0x4000000040;
    params.src.image.format = (&DAT_0094df50)[lVar4];
    params.src.image.extent.depth = params.src.image.imageType;
    params.dst.image.imageType = params.src.image.imageType;
    params.dst.image.format = params.src.image.format;
    params.dst.image.extent.depth = params.src.image.imageType;
    for (uVar6 = 0; format_02 = params.src.image.format, uVar6 < 0x40; uVar6 = uVar6 + 0x10) {
      TVar3 = ::vk::mapVkFormat(params.src.image.format);
      bVar2 = tcu::hasDepthComponent(TVar3.order);
      if (bVar2) {
        description._M_dataplus._M_p = (pointer)0x2;
        description._M_string_length = 0x100000000;
        description.field_2._M_allocated_capacity = 0;
        description.field_2._8_4_ = 0;
        description.field_2._12_4_ = 2;
        testName._M_dataplus._M_p = (pointer)0x2;
        testName._M_string_length = 0x100000000;
        testName.field_2._M_allocated_capacity = 0;
        testName.field_2._8_4_ = 0;
        testName.field_2._12_4_ = 2;
        std::
        vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
        ::push_back(&params.regions,(value_type *)&testName);
        format_02 = params.src.image.format;
      }
      TVar3 = ::vk::mapVkFormat(format_02);
      bVar2 = tcu::hasStencilComponent(TVar3.order);
      uVar5 = extraout_RDX;
      if (bVar2) {
        description._M_dataplus._M_p = (pointer)0x4;
        description._M_string_length = 0x100000000;
        description.field_2._M_allocated_capacity = 0;
        description.field_2._8_4_ = 0;
        description.field_2._12_4_ = 4;
        testName._M_dataplus._M_p = (pointer)0x4;
        testName._M_string_length = 0x100000000;
        testName.field_2._M_allocated_capacity = 0;
        testName.field_2._8_4_ = 0;
        testName.field_2._12_4_ = 4;
        std::
        vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
        ::push_back(&params.regions,(value_type *)&testName);
        uVar5 = extraout_RDX_00;
      }
    }
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_100,(_anonymous_namespace_ *)(ulong)params.src.image.format,(VkFormat)uVar5);
    std::operator+(&description,&local_100,"_");
    uVar1 = params.dst.image.format;
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_e0,(_anonymous_namespace_ *)(ulong)params.dst.image.format,format);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &((value_type *)&testName)->bufferCopy,&description,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&local_100);
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_a0,(_anonymous_namespace_ *)(ulong)(uint)format_02,format_00);
    std::operator+(&local_e0,"Copy from ",&local_a0);
    std::operator+(&local_100,&local_e0," to ");
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_c0,(_anonymous_namespace_ *)(ulong)(uint)uVar1,format_01);
    std::operator+(&description,&local_100,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    TestParams::TestParams(&local_80,&params);
    addTestGroup<vkt::api::(anonymous_namespace)::TestParams>
              (group,&testName,&description,addImageToImageAllFormatsDepthStencilFormatsTests,
               &local_80);
    TestParams::~TestParams(&local_80);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&testName);
    TestParams::~TestParams(&params);
  }
  return;
}

Assistant:

void addImageToImageAllFormatsDepthStencilTests (tcu::TestCaseGroup* group)
{
	const VkFormat	depthAndStencilFormats[]	=
	{
		VK_FORMAT_D16_UNORM,
		VK_FORMAT_X8_D24_UNORM_PACK32,
		VK_FORMAT_D32_SFLOAT,
		VK_FORMAT_S8_UINT,
		VK_FORMAT_D16_UNORM_S8_UINT,
		VK_FORMAT_D24_UNORM_S8_UINT,
		VK_FORMAT_D32_SFLOAT_S8_UINT,
	};

	for (int compatibleFormatsIndex = 0; compatibleFormatsIndex < DE_LENGTH_OF_ARRAY(depthAndStencilFormats); ++compatibleFormatsIndex)
	{
		TestParams	params;
		params.src.image.imageType			= VK_IMAGE_TYPE_2D;
		params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
		params.src.image.extent				= defaultExtent;
		params.dst.image.extent				= defaultExtent;
		params.src.image.format				= depthAndStencilFormats[compatibleFormatsIndex];
		params.dst.image.format				= params.src.image.format;

		const VkImageSubresourceLayers		defaultDepthSourceLayer		= { VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 0u, 1u };
		const VkImageSubresourceLayers		defaultStencilSourceLayer	= { VK_IMAGE_ASPECT_STENCIL_BIT, 0u, 0u, 1u };

		for (deInt32 i = 0; i < defaultSize; i += defaultFourthSize)
		{
			CopyRegion			copyRegion;
			const VkOffset3D	srcOffset	= {0, 0, 0};
			const VkOffset3D	dstOffset	= {i, defaultSize - i - defaultFourthSize, 0};
			const VkExtent3D	extent		= {defaultFourthSize, defaultFourthSize, 1};

			if (tcu::hasDepthComponent(mapVkFormat(params.src.image.format).order))
			{
				const VkImageCopy				testCopy	=
				{
					defaultDepthSourceLayer,	// VkImageSubresourceLayers	srcSubresource;
					srcOffset,					// VkOffset3D				srcOffset;
					defaultDepthSourceLayer,	// VkImageSubresourceLayers	dstSubresource;
					dstOffset,					// VkOffset3D				dstOffset;
					extent,						// VkExtent3D				extent;
				};

				copyRegion.imageCopy	= testCopy;
				params.regions.push_back(copyRegion);
			}
			if (tcu::hasStencilComponent(mapVkFormat(params.src.image.format).order))
			{
				const VkImageCopy				testCopy	=
				{
					defaultStencilSourceLayer,	// VkImageSubresourceLayers	srcSubresource;
					srcOffset,					// VkOffset3D				srcOffset;
					defaultStencilSourceLayer,	// VkImageSubresourceLayers	dstSubresource;
					dstOffset,					// VkOffset3D				dstOffset;
					extent,						// VkExtent3D				extent;
				};

				copyRegion.imageCopy	= testCopy;
				params.regions.push_back(copyRegion);
			}
		}

		const std::string testName		= getFormatCaseName(params.src.image.format) + "_" + getFormatCaseName(params.dst.image.format);
		const std::string description	= "Copy from " + getFormatCaseName(params.src.image.format) + " to " + getFormatCaseName(params.dst.image.format);
		addTestGroup(group, testName, description, addImageToImageAllFormatsDepthStencilFormatsTests, params);
	}
}